

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O2

ssl_hs_wait_t bssl::ssl_client_handshake(SSL_HANDSHAKE *hs)

{
  SSLTranscript *this;
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  _func_3149 *p_Var6;
  _Head_base<0UL,_buf_mem_st_*,_false> _Var7;
  EVP_PKEY *pkey;
  ssl_session_st *psVar8;
  CERT *pCVar9;
  _func_int_SSL_ptr_void_ptr *p_Var10;
  SSL_CREDENTIAL *cred;
  SSL_CONFIG *pSVar11;
  SSL *ssl;
  _func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *p_Var12;
  Span<const_unsigned_char> rhs;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> traffic_secret;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> premaster;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  Span<const_unsigned_char> in_03;
  pointer psVar16;
  pointer __p_00;
  Span<const_unsigned_char> signature;
  Span<const_unsigned_char> lhs;
  long lVar17;
  Span<const_unsigned_char> in_04;
  Span<const_unsigned_char> in_05;
  UniquePtr<SSL_SESSION> *pUVar18;
  InplaceVector<unsigned_char,_32UL> *buf;
  bool bVar19;
  char cVar20;
  uint16_t uVar21;
  ushort uVar22;
  uint16_t uVar23;
  uint32_t uVar24;
  int iVar25;
  ssl_private_key_result_t sVar26;
  ssl_verify_result_t sVar27;
  ssl_hs_wait_t sVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  SSLSessionType SVar32;
  CRYPTO_BUFFER *pCVar33;
  uchar *puVar34;
  char *__p_01;
  size_t sVar35;
  RSA *rsa;
  ulong uVar36;
  code *pcVar37;
  SSL_CIPHER *pSVar38;
  stack_st_SSL_CIPHER *sk;
  short sVar39;
  SSL_SESSION *extraout_RDX;
  SSL_SESSION *extraout_RDX_00;
  SSL_SESSION *extraout_RDX_01;
  SSL_SESSION *pSVar40;
  uchar *__last1;
  pointer __p_1;
  SSL_SESSION *session;
  pointer __p_02;
  SSL *pSVar41;
  SSL *pSVar42;
  CRYPTO_BUFFER_POOL *in_R8;
  CRYPTO_BUFFER_POOL *in_R9;
  long lVar43;
  long lVar44;
  pointer __p;
  initializer_list<bssl::SSLExtension_*> extensions;
  Span<const_unsigned_char> protocol;
  Span<unsigned_char> SVar45;
  Span<unsigned_char> out_enc;
  Span<const_unsigned_char> enc;
  Span<const_unsigned_char> protocol_00;
  size_t sStackY_330;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  CRYPTO_BUFFER_POOL *in_stack_fffffffffffffce0;
  size_t sig_len;
  CRYPTO_BUFFER_POOL *pCStack_310;
  UniquePtr<SSL_SESSION> *local_308;
  uint16_t signature_algorithm;
  undefined6 uStack_2fe;
  CBB child;
  uint8_t *ptr;
  CRYPTO_BUFFER_POOL *pCStack_2b0;
  UniquePtr<EVP_PKEY> *local_280;
  char *raw;
  CRYPTO_BUFFER_POOL *pCStack_270;
  UniquePtr<SSL_SESSION> *local_240;
  UniquePtr<SSL_CREDENTIAL> *local_238;
  uint16_t *local_230;
  SSL *local_228;
  InplaceVector<unsigned_char,_32UL> *local_220;
  CBB body;
  uint8_t ech_enc [65];
  CRYPTO_BUFFER_POOL *pCStack_130;
  
  local_308 = &hs->new_session;
  local_238 = &hs->credential;
  this = &hs->transcript;
  local_280 = &hs->peer_pubkey;
  local_240 = &hs->early_session;
  local_230 = &hs->max_version;
  local_220 = &hs->session_id;
  do {
    iVar4 = hs->state;
    sVar28 = ssl_hs_error;
    switch(iVar4) {
    case 0:
      pSVar41 = hs->ssl;
      ssl_do_info_callback(pSVar41,0x10,1);
      puVar1 = &pSVar41->s3->field_0xdc;
      *(ushort *)puVar1 = *(ushort *)puVar1 & 0xffdf;
      bVar19 = ssl_get_version_range(hs,&hs->min_version,local_230);
      sVar28 = ssl_hs_error;
      if (bVar19) {
        out_enc.size_ = (size_t)&child;
        out_enc.data_ = (uchar *)0x41;
        bVar19 = ssl_select_ech_config((bssl *)hs,(SSL_HANDSHAKE *)ech_enc,out_enc,(size_t *)in_R8);
        sVar28 = ssl_hs_error;
        if (bVar19) {
          iVar29 = SSL_is_dtls(hs->ssl);
          uVar3 = hs->max_version;
          if (iVar29 == 0) {
            uVar22 = 0x303;
            if (uVar3 < 0x303) {
              uVar22 = uVar3;
            }
          }
          else {
            uVar22 = (ushort)(uVar3 < 0x303) * 2 | 0xfefd;
          }
          hs->client_version = uVar22;
          bVar19 = ssl_setup_pake_shares(hs);
          if (bVar19) {
            pSVar40 = (pSVar41->session)._M_t.
                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
            sVar28 = ssl_hs_error;
            SVar32 = kNotResumable;
            if (pSVar40 != (SSL_SESSION *)0x0) {
              SVar32 = ssl_session_get_type(pSVar40);
              psVar8 = (pSVar41->session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              if (((psVar8->field_0x1b8 & 0x10) == 0) &&
                 (bVar19 = ssl_supports_version(hs,psVar8->ssl_version), bVar19)) {
                if ((hs->selected_ech_config)._M_t.
                    super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl == (ECHConfig *)0x0
                   ) {
                  pSVar40 = extraout_RDX;
                  if (SVar32 != kNotResumable) goto LAB_0013f1d4;
                }
                else {
                  uVar21 = ssl_session_protocol_version
                                     ((pSVar41->session)._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
                  if ((SVar32 != kNotResumable) && (pSVar40 = extraout_RDX_00, 0x303 < uVar21)) {
LAB_0013f1d4:
                    if (((SVar32 != kTicket) ||
                        (uVar24 = SSL_get_options(pSVar41), pSVar40 = extraout_RDX_01,
                        (uVar24 >> 0xe & 1) == 0)) &&
                       (((((hs->pake_prover)._M_t.
                           super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>.
                           _M_t.
                           super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>
                           .super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl ==
                           (Prover *)0x0 &&
                          (bVar19 = ssl_session_is_time_valid
                                              ((bssl *)pSVar41,
                                               (SSL *)(pSVar41->session)._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl,pSVar40), bVar19)) &&
                         (uVar31 = SSL_is_quic(pSVar41),
                         uVar31 == ((*(uint *)&((pSVar41->session)._M_t.
                                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                               _M_head_impl)->field_0x1b8 >> 5 & 1) != 0))) &&
                        ((pSVar41->s3->field_0xdc & 0x10) == 0)))) goto LAB_0013f235;
                  }
                }
              }
              SVar32 = kNotResumable;
              ssl_set_session(pSVar41,(SSL_SESSION *)0x0);
            }
LAB_0013f235:
            iVar29 = RAND_bytes(pSVar41->s3->client_random,0x20);
            if ((iVar29 != 0) &&
               (((hs->selected_ech_config)._M_t.
                 super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl == (ECHConfig *)0x0 ||
                (iVar29 = RAND_bytes(hs->inner_client_random,0x20), iVar29 != 0)))) {
              if ((*local_230 < 0x304) || (iVar29 = SSL_is_quic(pSVar41), iVar29 != 0)) {
                bVar19 = false;
              }
              else {
                iVar29 = SSL_is_dtls(pSVar41);
                bVar19 = iVar29 == 0;
              }
              buf = local_220;
              if (SVar32 == kTicket) {
LAB_0013f2b7:
                InplaceVector<unsigned_char,_32UL>::ResizeForOverwrite(local_220,0x20);
                iVar29 = RAND_bytes((uchar *)buf,(uint)(hs->session_id).size_);
                if (iVar29 != 0) goto LAB_0013f2e1;
                goto LAB_0013ed64;
              }
              if (SVar32 == kID) {
                InplaceVector<unsigned_char,_32UL>::operator=
                          (local_220,
                           &((pSVar41->session)._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                            session_id);
              }
              else if (bVar19) goto LAB_0013f2b7;
LAB_0013f2e1:
              ssl = hs->ssl;
              if ((ssl->field_0xa4 & 1) != 0) {
                __assert_fail("!ssl->server",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x126,
                              "ssl_early_data_reason_t bssl::should_offer_early_data(const SSL_HANDSHAKE *)"
                             );
              }
              sStackY_330 = 1;
              if (((ssl->field_0xa4 & 4) == 0) || (sStackY_330 = 3, *local_230 < 0x304)) {
LAB_0013f31f:
                pSVar41->s3->early_data_reason = (ssl_early_data_reason_t)sStackY_330;
              }
              else {
                iVar29 = SSL_is_dtls(ssl);
                sStackY_330 = 3;
                if (iVar29 != 0) goto LAB_0013f31f;
                pSVar40 = (ssl->session)._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                sStackY_330 = 5;
                if (pSVar40 == (SSL_SESSION *)0x0) goto LAB_0013f31f;
                uVar21 = ssl_session_protocol_version(pSVar40);
                sStackY_330 = 7;
                if ((uVar21 < 0x304) ||
                   (psVar8 = (ssl->session)._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                   psVar8->ticket_max_early_data == 0)) goto LAB_0013f31f;
                puVar34 = (uchar *)(psVar8->early_alpn).size_;
                if (puVar34 != (uchar *)0x0) {
                  protocol_00.size_ = 7;
                  protocol_00.data_ = puVar34;
                  bVar19 = ssl_is_alpn_protocol_allowed
                                     ((bssl *)hs,(SSL_HANDSHAKE *)(psVar8->early_alpn).data_,
                                      protocol_00);
                  sStackY_330 = 9;
                  if (bVar19) {
                    psVar8 = (ssl->session)._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                    if ((psVar8->field_0x1b8 & 0x40) == 0) goto LAB_0013f7dd;
                    body.child._0_1_ = '\0';
                    body.child._1_1_ = '\0';
                    body.child._2_6_ = 0;
                    body.is_child = '\0';
                    body._9_7_ = 0;
                    protocol.size_ = (size_t)in_R8;
                    protocol.data_ = (uchar *)(psVar8->early_alpn).size_;
                    bVar19 = ssl_get_local_application_settings
                                       ((bssl *)hs,(SSL_HANDSHAKE *)&body,
                                        (Span<const_unsigned_char> *)(psVar8->early_alpn).data_,
                                        protocol);
                    if (bVar19) {
                      lhs.data_._1_1_ = body.child._1_1_;
                      lhs.data_._0_1_ = (uint8_t)body.child;
                      lhs.data_._2_6_ = body.child._2_6_;
                      lhs.size_ = body._8_8_;
                      psVar8 = (ssl->session)._M_t.
                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                      sStackY_330 = (psVar8->local_application_settings).size_;
                      rhs.data_ = (psVar8->local_application_settings).data_;
                      rhs.size_ = (psVar8->local_application_settings).size_;
                      bVar19 = internal::operator!=(lhs,rhs);
                      if (!bVar19) goto LAB_0013f7dd;
                    }
                    sStackY_330 = 0xe;
                  }
                  goto LAB_0013f31f;
                }
LAB_0013f7dd:
                hs->field_0x6c9 = hs->field_0x6c9 | 8;
              }
              sVar28 = ssl_hs_error;
              bVar19 = ssl_setup_key_shares(hs,0);
              if ((((bVar19) && (bVar19 = ssl_setup_extension_permutation(hs), bVar19)) &&
                  (enc.data_._1_1_ = child.child._1_1_, enc.data_._0_1_ = (byte)child.child,
                  enc.data_._2_1_ = child.child._2_1_, enc.data_._3_1_ = child.child._3_1_,
                  enc.data_._4_4_ = child.child._4_4_, enc.size_ = sStackY_330,
                  bVar19 = ssl_encrypt_client_hello((bssl *)hs,(SSL_HANDSHAKE *)ech_enc,enc), bVar19
                  )) && (bVar19 = ssl_add_client_hello(hs), bVar19)) {
                hs->state = 1;
                sVar28 = ssl_hs_flush;
              }
            }
          }
        }
      }
      break;
    case 1:
      iVar29 = 3;
      if ((hs->field_0x6c9 & 8) != 0) {
        pSVar41 = hs->ssl;
        UpRef((bssl *)ech_enc,&pSVar41->session);
        psVar16 = (pointer)CONCAT62(ech_enc._2_6_,CONCAT11(ech_enc[1],ech_enc[0]));
        ech_enc[0] = '\0';
        ech_enc[1] = '\0';
        ech_enc[2] = '\0';
        ech_enc[3] = '\0';
        ech_enc[4] = '\0';
        ech_enc[5] = '\0';
        ech_enc[6] = '\0';
        ech_enc[7] = '\0';
        std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)local_240,psVar16);
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)ech_enc);
        pSVar41->s3->version =
             ((hs->early_session)._M_t.
              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ssl_version;
        hs->field_0x6c9 = hs->field_0x6c9 | 0x40;
        iVar29 = 2;
      }
LAB_0013db79:
      hs->state = iVar29;
LAB_0013db8c:
      sVar28 = ssl_hs_ok;
      break;
    case 2:
      pSVar41 = hs->ssl;
      if (((pSVar41->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->reverify_on_resume == true) {
        sVar28 = ssl_hs_error;
        sVar27 = ssl_reverify_peer_cert(hs,false);
        if (sVar27 != ssl_verify_invalid) {
          sVar28 = ssl_hs_certificate_verify;
          if (sVar27 != ssl_verify_retry) goto LAB_0013db94;
LAB_0013d576:
          hs->state = sVar27;
        }
      }
      else {
LAB_0013db94:
        bVar19 = (*pSVar41->method->add_change_cipher_spec)(pSVar41);
        sVar28 = ssl_hs_error;
        if (bVar19) {
          bVar19 = tls13_init_early_key_schedule
                             (hs,(hs->early_session)._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
          sVar28 = ssl_hs_error;
          if (bVar19) {
            bVar19 = tls13_derive_early_secret(hs);
            sVar28 = ssl_hs_error;
            if (bVar19) {
              in_R9 = (CRYPTO_BUFFER_POOL *)(ulong)(hs->early_traffic_secret).size_;
              traffic_secret.data_._4_4_ = in_stack_fffffffffffffcdc;
              traffic_secret.data_._0_4_ = in_stack_fffffffffffffcd8;
              traffic_secret.size_ = (size_t)in_stack_fffffffffffffce0;
              in_R8 = (CRYPTO_BUFFER_POOL *)&hs->early_traffic_secret;
              bVar19 = tls13_set_traffic_key
                                 ((bssl *)hs->ssl,(SSL *)0x1,ssl_encryption_early_data,
                                  (evp_aead_direction_t)
                                  (hs->early_session)._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                  (SSL_SESSION *)&hs->early_traffic_secret,traffic_secret);
              sVar28 = ssl_hs_error;
              if (bVar19) {
                hs->field_0x6c9 = hs->field_0x6c9 | 0x24;
                sVar27 = ssl_verify_retry|ssl_verify_invalid;
                sVar28 = ssl_hs_early_return;
                goto LAB_0013d576;
              }
            }
          }
        }
      }
      break;
    case 3:
      pSVar42 = (SSL *)hs->ssl;
      cVar20 = (**(code **)(*(long *)pSVar42 + 0x18))(pSVar42);
      sVar28 = ssl_hs_read_server_hello;
      if (cVar20 != '\0') {
        iVar29 = SSL_is_dtls((SSL *)pSVar42);
        if (((iVar29 == 0) || ((hs->field_0x6cb & 2) != 0)) || (body.child._1_1_ != '\x03')) {
          ech_enc[0x10] = '\0';
          ech_enc[0x11] = '\0';
          ech_enc[0x38] = '\0';
          ech_enc[0x39] = '\0';
          ech_enc[0x3a] = '\0';
          sig_len._0_1_ = 0x32;
          bVar19 = ssl_parse_server_hello
                             ((ParsedServerHello *)ech_enc,(uint8_t *)&sig_len,(SSLMessage *)&body);
          if (!bVar19) {
LAB_0013f03d:
            uVar31 = (uint)(byte)sig_len;
            goto LAB_0013f048;
          }
          iVar29 = SSL_is_dtls(hs->ssl);
          sVar39 = -0x103;
          if (iVar29 == 0) {
            sVar39 = 0x303;
          }
          if (sVar39 == ech_enc._16_2_) {
            child.child._0_1_ = 0x2b;
            child.child._1_1_ = 0;
            child.child._2_1_ = 1;
            child.child._3_1_ = '\0';
            child.is_child = '\0';
            child._9_7_ = 0;
            child.u.base.buf = (uint8_t *)0x0;
            raw._0_1_ = (char)stack0xfffffffffffffec8;
            raw._1_1_ = (char)((ulong)stack0xfffffffffffffec8 >> 8);
            raw._2_6_ = (undefined6)((ulong)stack0xfffffffffffffec8 >> 0x10);
            pCStack_270 = pCStack_130;
            ptr = (uint8_t *)&child;
            in_R8 = (CRYPTO_BUFFER_POOL *)0x1;
            extensions._M_len = 1;
            extensions._M_array = (iterator)0x1;
            bVar19 = ssl_parse_extensions
                               ((bssl *)&raw,(CBS *)&sig_len,(uint8_t *)&ptr,extensions,
                                SUB81(in_R9,0));
            if (!bVar19) goto LAB_0013f03d;
            if (child.child._3_1_ == '\0') goto LAB_0013ed9e;
            iVar29 = CBS_get_u16((CBS *)&child.is_child,(uint16_t *)&ptr);
            if ((iVar29 == 0) || (child.u.base.buf != (uint8_t *)0x0)) {
              sig_len._0_1_ = 0x32;
              goto LAB_0013f03d;
            }
            uVar21 = (uint16_t)ptr;
          }
          else {
LAB_0013ed9e:
            ptr = (uint8_t *)CONCAT62(ptr._2_6_,ech_enc._16_2_);
            uVar21 = ech_enc._16_2_;
          }
          bVar19 = ssl_supports_version(hs,uVar21);
          if (bVar19) {
            p_Var6 = pSVar42->handshake_func;
            if (((byte)p_Var6[0xdc] & 0x10) == 0) {
              if ((*(uint16_t *)(p_Var6 + 0xd0) != 0) &&
                 (((hs->field_0x6c9 & 0x40) == 0 ||
                  (*(uint16_t *)(p_Var6 + 0xd0) !=
                   ((local_240->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                    ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ssl_version)))) {
                __assert_fail("ssl->s3->version == 0 || (hs->is_early_version && ssl->s3->version == hs->early_session->ssl_version)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x262,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              *(uint16_t *)(p_Var6 + 0xd0) = (uint16_t)ptr;
              uVar31 = *(uint *)&hs->field_0x6c8 & 0xffffbfff;
              *(uint *)&hs->field_0x6c8 = uVar31;
            }
            else {
              if ((uint16_t)ptr != *(short *)(p_Var6 + 0xd0)) {
                iVar29 = 0xf6;
                in_R8 = (CRYPTO_BUFFER_POOL *)0x266;
                goto LAB_0013ee2b;
              }
              uVar31 = *(uint *)&hs->field_0x6c8;
            }
            if (((uVar31 >> 0xb & 1) == 0) ||
               (*(uint16_t *)(pSVar42->handshake_func + 0xd0) ==
                ((local_240->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ssl_version)) {
              uVar21 = ssl_protocol_version((SSL *)pSVar42);
              if (uVar21 < 0x304) {
                if ((hs->pake_prover)._M_t.
                    super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl ==
                    (Prover *)0x0) {
                  std::__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> *)
                             hs->key_shares,(pointer)0x0);
                  std::__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> *)
                             (hs->key_shares + 1),(pointer)0x0);
                  ssl_done_writing_client_hello(hs);
                  p_Var6 = pSVar42->handshake_func;
                  if ((hs->selected_ech_config)._M_t.
                      super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl !=
                      (ECHConfig *)0x0) {
                    *(undefined4 *)(p_Var6 + 0xd8) = 2;
                  }
                  uVar13 = *(undefined8 *)ech_enc._24_8_;
                  uVar14 = *(undefined8 *)(ech_enc._24_8_ + 8);
                  uVar15 = *(undefined8 *)(ech_enc._24_8_ + 0x18);
                  *(undefined8 *)(p_Var6 + 0x20) = *(undefined8 *)(ech_enc._24_8_ + 0x10);
                  *(undefined8 *)(p_Var6 + 0x28) = uVar15;
                  *(undefined8 *)(p_Var6 + 0x10) = uVar13;
                  *(undefined8 *)(p_Var6 + 0x18) = uVar14;
                  if ((((byte)pSVar42->handshake_func[0xdc] & 0x10) == 0) && (0x303 < *local_230)) {
                    pcVar37 = pSVar42->handshake_func + 0x10;
                    child.child._0_1_ = (byte)pcVar37;
                    child.child._1_1_ = (undefined1)((ulong)pcVar37 >> 8);
                    child.child._2_1_ = (undefined1)((ulong)pcVar37 >> 0x10);
                    child.child._3_1_ = (char)((ulong)pcVar37 >> 0x18);
                    child.child._4_4_ = (undefined4)((ulong)pcVar37 >> 0x20);
                    child.is_child = ' ';
                    child._9_7_ = 0;
                    SVar45 = Span<unsigned_char>::last((Span<unsigned_char> *)&child,8);
                    puVar34 = SVar45.data_;
                    __last1 = puVar34 + SVar45.size_;
                    bVar19 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                                       (puVar34,__last1,(uchar *)"DOWNGRD",
                                        (uchar *)&kTLS13DowngradeRandom);
                    if ((!bVar19) &&
                       ((bVar19 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                                            (puVar34,__last1,(uchar *)&kTLS13DowngradeRandom,
                                             (uchar *)&kJDK11DowngradeRandom), !bVar19 &&
                        (bVar19 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                                            (puVar34,__last1,(uchar *)&kJDK11DowngradeRandom,""),
                        !bVar19)))) goto LAB_0013f4bc;
                    iVar29 = 0x129;
                    in_R8 = (CRYPTO_BUFFER_POOL *)0x2b9;
                    goto LAB_0013f5e9;
                  }
LAB_0013f4bc:
                  pSVar38 = SSL_get_cipher_by_value(ech_enc._56_2_);
                  p_Var12 = hs->config->psk_client_callback;
                  if (((pSVar38 == (SSL_CIPHER *)0x0) ||
                      ((pSVar38->algorithm_mkey &
                       (uint)(p_Var12 ==
                             (_func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *)0x0) << 2
                       ) != 0)) ||
                     ((pSVar38->algorithm_auth &
                      (uint)(p_Var12 ==
                            (_func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *)0x0) << 3)
                      != 0)) {
LAB_0013f5d0:
                    iVar29 = 0xf2;
                    in_R8 = (CRYPTO_BUFFER_POOL *)0x2c9;
                  }
                  else {
                    uVar21 = SSL_CIPHER_get_min_version(pSVar38);
                    uVar23 = ssl_protocol_version((SSL *)pSVar42);
                    if (uVar23 < uVar21) goto LAB_0013f5d0;
                    uVar21 = SSL_CIPHER_get_max_version(pSVar38);
                    uVar23 = ssl_protocol_version((SSL *)pSVar42);
                    if (uVar21 < uVar23) goto LAB_0013f5d0;
                    sk = (stack_st_SSL_CIPHER *)SSL_get_ciphers(pSVar42);
                    iVar29 = sk_SSL_CIPHER_find(sk,(size_t *)0x0,pSVar38);
                    if (iVar29 == 0) goto LAB_0013f5d0;
                    hs->new_cipher = pSVar38;
                    uVar36 = (ulong)(hs->session_id).size_;
                    if ((uVar36 == 0) ||
                       (bVar19 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                                           ((uchar *)ech_enc._40_8_,
                                            (uchar *)(ech_enc._48_8_ + ech_enc._40_8_),
                                            (uchar *)local_220,
                                            (uchar *)(local_220->storage_ + uVar36)), !bVar19)) {
                      ssl_set_session((SSL *)pSVar42,(SSL_SESSION *)0x0);
                      bVar19 = ssl_get_new_session(hs);
                      if (!bVar19) goto LAB_0013fad8;
                      in_05.size_._0_1_ = ech_enc[0x30];
                      in_05.size_._1_1_ = ech_enc[0x31];
                      in_05.size_._2_1_ = ech_enc[0x32];
                      in_05.size_._3_1_ = ech_enc[0x33];
                      in_05.size_._4_1_ = ech_enc[0x34];
                      in_05.size_._5_1_ = ech_enc[0x35];
                      in_05.size_._6_1_ = ech_enc[0x36];
                      in_05.size_._7_1_ = ech_enc[0x37];
                      in_05.data_ = (uchar *)ech_enc._40_8_;
                      InplaceVector<unsigned_char,_32UL>::CopyFrom
                                (&((hs->new_session)._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                  session_id,in_05);
                      ((hs->new_session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->cipher =
                           hs->new_cipher;
LAB_0013fa57:
                      uVar21 = ssl_protocol_version((SSL *)pSVar42);
                      bVar19 = SSLTranscript::InitHash(this,uVar21,hs->new_cipher);
                      if ((!bVar19) || (bVar19 = ssl_hash_message(hs,(SSLMessage *)&body), !bVar19))
                      goto LAB_0013fad8;
                      if ((pSVar42->init_msg != (void *)0x0) ||
                         (bVar19 = ssl_cipher_uses_certificate_auth(hs->new_cipher), !bVar19)) {
                        SSLTranscript::FreeBuffer(this);
                      }
                      if (ech_enc[0x3a] == '\0') {
                        bVar19 = ssl_parse_serverhello_tlsext(hs,(CBS *)(ech_enc + 0x40));
                        if (!bVar19) {
                          iVar29 = 0xbe;
                          in_R8 = (CRYPTO_BUFFER_POOL *)0x319;
                          goto LAB_0013f81d;
                        }
                        if ((pSVar42->init_msg == (void *)0x0) ||
                           (bVar2 = *(byte *)((long)pSVar42->init_msg + 0x1b8),
                           (*(uint *)&hs->field_0x6c8 >> 0x11 & 1) == (bVar2 & 1))) {
                          (**(code **)(*(long *)pSVar42 + 0x20))(pSVar42);
                          if (pSVar42->init_msg == (void *)0x0) {
                            hs->state = 5;
                          }
                          else if ((pSVar42->packet[0x178] == '\x01') &&
                                  (bVar19 = ssl_cipher_uses_certificate_auth(hs->new_cipher), bVar19
                                  )) {
                            hs->state = 8;
                          }
                          else {
                            hs->state = 0x11;
                          }
                          goto LAB_0013db8c;
                        }
                        if ((bVar2 & 1) == 0) {
                          iVar29 = 0xcd;
                          in_R8 = (CRYPTO_BUFFER_POOL *)0x322;
                        }
                        else {
                          iVar29 = 0xcc;
                          in_R8 = (CRYPTO_BUFFER_POOL *)0x320;
                        }
                        ERR_put_error(0x10,0,iVar29,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                      ,(int)in_R8);
                        uVar31 = 0x28;
                        goto LAB_0013f048;
                      }
                      iVar29 = 0xee;
                      in_R8 = (CRYPTO_BUFFER_POOL *)0x313;
                    }
                    else {
                      pSVar40 = (SSL_SESSION *)pSVar42->init_msg;
                      if ((pSVar40 == (SSL_SESSION *)0x0) ||
                         (*(int *)(pSVar42->handshake_func + 0xd8) == 2)) {
                        iVar29 = 0x11e;
                        in_R8 = (CRYPTO_BUFFER_POOL *)0x2da;
                      }
                      else if (pSVar40->ssl_version == *(uint16_t *)(pSVar42->handshake_func + 0xd0)
                              ) {
                        if (pSVar40->cipher == hs->new_cipher) {
                          bVar19 = ssl_session_is_context_valid(hs,pSVar40);
                          if (bVar19) {
                            uVar3 = *(ushort *)(pSVar42->handshake_func + 0xdc);
                            if ((uVar3 & 0x10) != 0) {
                              __assert_fail("!ssl->s3->initial_handshake_complete",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                            ,0x2f0,
                                            "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)"
                                           );
                            }
                            *(ushort *)(pSVar42->handshake_func + 0xdc) = uVar3 | 0x20;
                            goto LAB_0013fa57;
                          }
                          iVar29 = 0x65;
                          in_R8 = (CRYPTO_BUFFER_POOL *)0x2eb;
                        }
                        else {
                          iVar29 = 0xbb;
                          in_R8 = (CRYPTO_BUFFER_POOL *)0x2e4;
                        }
                      }
                      else {
                        iVar29 = 0xbc;
                        in_R8 = (CRYPTO_BUFFER_POOL *)0x2df;
                      }
                    }
                  }
LAB_0013f5e9:
                  ERR_put_error(0x10,0,iVar29,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,(int)in_R8);
                  iVar29 = 0x2f;
                  goto LAB_0013ee38;
                }
                iVar29 = 0xf0;
                in_R8 = (CRYPTO_BUFFER_POOL *)0x299;
              }
              else {
                if ((hs->field_0x6cb & 2) == 0) {
                  hs->state = 4;
                  goto LAB_0013db8c;
                }
                iVar29 = 0x9f;
                in_R8 = (CRYPTO_BUFFER_POOL *)0x28d;
              }
            }
            else {
              uVar21 = ssl_protocol_version((SSL *)pSVar42);
              if (0x303 < uVar21) {
                __assert_fail("ssl_protocol_version(ssl) < TLS1_3_VERSION",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x272,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              uVar21 = ssl_session_protocol_version
                                 ((local_240->_M_t).
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
              if (uVar21 < 0x304) {
                __assert_fail("ssl_session_protocol_version(hs->early_session.get()) >= TLS1_3_VERSION"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x274,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              iVar29 = SSL_is_dtls((SSL *)pSVar42);
              if (iVar29 != 0) {
                __assert_fail("!SSL_is_dtls(ssl)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x284,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              hs->field_0x6c9 = hs->field_0x6c9 & 0xdf;
              iVar29 = 0x116;
              in_R8 = (CRYPTO_BUFFER_POOL *)0x286;
            }
          }
          else {
            iVar29 = 0xf0;
            in_R8 = (CRYPTO_BUFFER_POOL *)0x258;
          }
LAB_0013ee2b:
          ERR_put_error(0x10,0,iVar29,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,(int)in_R8);
          iVar29 = 0x46;
LAB_0013ee38:
          sVar28 = ssl_hs_error;
          ssl_send_alert((SSL *)pSVar42,2,iVar29);
        }
        else {
          pSVar42 = (SSL *)hs->ssl;
          iVar29 = SSL_is_dtls((SSL *)pSVar42);
          if (iVar29 == 0) {
            __assert_fail("SSL_is_dtls(ssl)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x1ff,
                          "bool bssl::handle_hello_verify_request(SSL_HANDSHAKE *, const SSLMessage &)"
                         );
          }
          if (body.child._1_1_ != '\x03') {
            __assert_fail("msg.type == DTLS1_MT_HELLO_VERIFY_REQUEST",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x200,
                          "bool bssl::handle_hello_verify_request(SSL_HANDSHAKE *, const SSLMessage &)"
                         );
          }
          if ((hs->field_0x6cb & 2) != 0) {
            __assert_fail("!hs->received_hello_verify_request",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x201,
                          "bool bssl::handle_hello_verify_request(SSL_HANDSHAKE *, const SSLMessage &)"
                         );
          }
          ech_enc[0] = body.is_child;
          ech_enc[1] = body._9_1_;
          ech_enc._2_6_ = body._10_6_;
          ech_enc._8_8_ = body.u.base.buf;
          iVar29 = CBS_get_u16((CBS *)ech_enc,(uint16_t *)&raw);
          if (((iVar29 == 0) ||
              (iVar29 = CBS_get_u8_length_prefixed((CBS *)ech_enc,(CBS *)&child), iVar29 == 0)) ||
             (ech_enc._8_8_ != 0)) {
            in_R8 = (CRYPTO_BUFFER_POOL *)0x208;
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x208);
            uVar31 = 0x32;
LAB_0013f048:
            ssl_send_alert((SSL *)pSVar42,2,uVar31);
          }
          else {
            in_01.data_._1_1_ = child.child._1_1_;
            in_01.data_._0_1_ = (byte)child.child;
            in_01.data_._2_1_ = child.child._2_1_;
            in_01.data_._3_1_ = child.child._3_1_;
            in_01.data_._4_4_ = child.child._4_4_;
            in_01.size_ = child._8_8_;
            bVar19 = Array<unsigned_char>::CopyFrom(&hs->dtls_cookie,in_01);
            uVar31 = 0x50;
            if (!bVar19) goto LAB_0013f048;
            hs->field_0x6cb = hs->field_0x6cb | 2;
            (**(code **)(*(long *)pSVar42 + 0x20))(pSVar42);
            bVar19 = SSLTranscript::Init(this);
            if (bVar19) {
              bVar19 = ssl_add_client_hello(hs);
              sVar28 = ssl_hs_error;
              if (!bVar19) break;
              hs->field_0x6cb = hs->field_0x6cb | 2;
              hs->state = 3;
              goto LAB_0013d5fc;
            }
          }
LAB_0013f04d:
          sVar28 = ssl_hs_error;
        }
      }
      break;
    case 4:
      sVar28 = tls13_client_handshake(hs);
      if (sVar28 == ssl_hs_ok) {
LAB_0013d478:
        hs->state = 0x14;
        goto LAB_0013db8c;
      }
      break;
    case 5:
      pSVar42 = (SSL *)hs->ssl;
      bVar19 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
      if (!bVar19) {
LAB_0013d99a:
        hs->state = 6;
        goto LAB_0013db8c;
      }
      cVar20 = (**(code **)(*(long *)pSVar42 + 0x18))(pSVar42);
      sVar28 = ssl_hs_read_message;
      if (cVar20 != '\0') {
        bVar19 = ssl_check_message_type((SSL *)pSVar42,(SSLMessage *)ech_enc,0xb);
        sVar28 = ssl_hs_error;
        if ((bVar19) &&
           (bVar19 = ssl_hash_message(hs,(SSLMessage *)ech_enc), pUVar18 = local_308, bVar19)) {
          body._10_1_ = ech_enc[0x12];
          body._11_1_ = ech_enc[0x13];
          body._12_1_ = ech_enc[0x14];
          body._13_1_ = ech_enc[0x15];
          body._14_1_ = ech_enc[0x16];
          body._15_1_ = ech_enc[0x17];
          body.is_child = ech_enc[0x10];
          body._9_1_ = ech_enc[0x11];
          body.child._0_1_ = (uint8_t)ech_enc._8_8_;
          body.child._1_1_ = SUB81(ech_enc._8_8_,1);
          body.child._2_6_ = SUB86(ech_enc._8_8_,2);
          child.child._0_1_ = 0x32;
          in_R9 = *(CRYPTO_BUFFER_POOL **)(pSVar42->packet + 0x250);
          in_R8 = (CRYPTO_BUFFER_POOL *)&body;
          bVar19 = ssl_parse_cert_chain
                             ((uint8_t *)&child,
                              &((local_308->_M_t).
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs,
                              local_280,(uint8_t *)0x0,(CBS *)in_R8,in_R9);
          if (bVar19) {
            sVar35 = OPENSSL_sk_num((OPENSSL_STACK *)
                                    (((pUVar18->_M_t).
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)
                                    ->certs)._M_t.
                                    super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                   );
            if (((sVar35 == 0) || (body._8_8_ != 0)) ||
               (cVar20 = (**(code **)(*(long *)(pSVar42->packet + 0x10) + 0x30))
                                   ((pUVar18->_M_t).
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl),
               cVar20 == '\0')) {
              in_R8 = (CRYPTO_BUFFER_POOL *)0x35f;
              ERR_put_error(0x10,0,0x89,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x35f);
              iVar29 = 0x32;
              goto LAB_0013ee38;
            }
            pkey = (hs->peer_pubkey)._M_t.
                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
            pCVar33 = (CRYPTO_BUFFER *)
                      OPENSSL_sk_value((OPENSSL_STACK *)
                                       (((hs->new_session)._M_t.
                                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                        _M_head_impl)->certs)._M_t.
                                       super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                       ,0);
            bVar19 = ssl_check_leaf_certificate(hs,pkey,pCVar33);
            if (bVar19) {
              (**(code **)(*(long *)pSVar42 + 0x20))(pSVar42);
              goto LAB_0013d99a;
            }
            uVar31 = 0x2f;
          }
          else {
            uVar31 = (uint)(byte)child.child;
          }
          goto LAB_0013f048;
        }
      }
      break;
    case 6:
      if ((hs->field_0x6c8 & 0x40) == 0) {
LAB_0013da97:
        hs->state = 7;
        goto LAB_0013db8c;
      }
      pSVar41 = hs->ssl;
      bVar19 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)ech_enc);
      sVar28 = ssl_hs_read_message;
      if (!bVar19) break;
      if (ech_enc[1] != '\x16') goto LAB_0013da97;
      bVar19 = ssl_hash_message(hs,(SSLMessage *)ech_enc);
      sVar28 = ssl_hs_error;
      if (!bVar19) break;
      body._10_1_ = ech_enc[0x12];
      body._11_1_ = ech_enc[0x13];
      body._12_1_ = ech_enc[0x14];
      body._13_1_ = ech_enc[0x15];
      body._14_1_ = ech_enc[0x16];
      body._15_1_ = ech_enc[0x17];
      body.is_child = ech_enc[0x10];
      body._9_1_ = ech_enc[0x11];
      body.child._0_1_ = (uint8_t)ech_enc._8_8_;
      body.child._1_1_ = SUB81(ech_enc._8_8_,1);
      body.child._2_6_ = SUB86(ech_enc._8_8_,2);
      iVar29 = CBS_get_u8((CBS *)&body,(uint8_t *)&raw);
      if ((((iVar29 != 0) && ((char)raw == '\x01')) &&
          (iVar29 = CBS_get_u24_length_prefixed((CBS *)&body,(CBS *)&child), pUVar18 = local_308,
          iVar29 != 0)) && ((child._8_8_ != 0 && (body._8_8_ == 0)))) {
        psVar8 = (local_308->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        pCVar33 = CRYPTO_BUFFER_new_from_CBS
                            ((CBS *)&child,
                             ((pSVar41->ctx)._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->pool);
        std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                   &psVar8->ocsp_response,pCVar33);
        if ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
            *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
             &(((pUVar18->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ocsp_response)._M_t.
              super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> !=
            (crypto_buffer_st *)0x0) {
          (*pSVar41->method->next_message)(pSVar41);
          hs->state = 7;
          goto LAB_0013f749;
        }
LAB_0013f1c2:
        uVar31 = 0x50;
        goto LAB_0013ed5f;
      }
      iVar29 = 0x89;
      in_R8 = (CRYPTO_BUFFER_POOL *)0x390;
LAB_0013ea71:
      ERR_put_error(0x10,0,iVar29,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,(int)in_R8);
      iVar29 = 0x32;
LAB_0013ea7e:
      sVar28 = ssl_hs_error;
      ssl_send_alert(pSVar41,2,iVar29);
      break;
    case 7:
      bVar19 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
      iVar29 = 9;
      sVar28 = ssl_hs_ok;
      if (bVar19) {
        sVar27 = ssl_verify_peer_cert(hs);
        sVar28 = ssl_hs_error;
        if (sVar27 == ssl_verify_invalid) break;
        iVar29 = 7;
        sVar28 = ssl_hs_certificate_verify;
        if (sVar27 != ssl_verify_retry) {
          iVar29 = 9;
          sVar28 = ssl_hs_ok;
        }
      }
      hs->state = iVar29;
      break;
    case 8:
      if (((hs->ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->reverify_on_resume == false) {
        __assert_fail("hs->ssl->ctx->reverify_on_resume",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                      ,0x3b7,
                      "enum ssl_hs_wait_t bssl::do_reverify_server_certificate(SSL_HANDSHAKE *)");
      }
      sVar27 = ssl_reverify_peer_cert(hs,true);
      sVar28 = ssl_hs_error;
      if (sVar27 != ssl_verify_invalid) {
        iVar29 = 8;
        sVar28 = ssl_hs_certificate_verify;
        if (sVar27 != ssl_verify_retry) {
          iVar29 = 0x11;
          sVar28 = ssl_hs_ok;
        }
        hs->state = iVar29;
      }
      break;
    case 9:
      pSVar41 = hs->ssl;
      bVar19 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)&body);
      sVar28 = ssl_hs_read_message;
      if (bVar19) {
        if (body.child._1_1_ != '\f') {
          bVar19 = ssl_cipher_requires_server_key_exchange(hs->new_cipher);
          if (!bVar19) {
LAB_0013f742:
            hs->state = 10;
            goto LAB_0013f749;
          }
          in_R8 = (CRYPTO_BUFFER_POOL *)0x3d1;
LAB_0013e206:
          ERR_put_error(0x10,0,0xdf,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,(int)in_R8);
          iVar29 = 10;
          goto LAB_0013ea7e;
        }
        bVar19 = ssl_hash_message(hs,(SSLMessage *)&body);
        sVar28 = ssl_hs_error;
        if (!bVar19) break;
        uVar31 = hs->new_cipher->algorithm_mkey;
        uVar5 = hs->new_cipher->algorithm_auth;
        child.child._0_1_ = body.is_child;
        child.child._1_1_ = body._9_1_;
        child.child._2_1_ = body._10_1_;
        child.child._3_1_ = body._11_1_;
        child.child._4_4_ = body._12_4_;
        child._8_8_ = body.u.base.buf;
        if ((uVar5 & 8) == 0) {
LAB_0013d50f:
          if ((uVar31 & 2) == 0) {
            if ((uVar31 & 4) == 0) {
              in_R8 = (CRYPTO_BUFFER_POOL *)0x423;
              goto LAB_0013e206;
            }
          }
          else {
            iVar29 = CBS_get_u8((CBS *)&child,(uint8_t *)&ptr);
            if ((((iVar29 == 0) || ((byte)ptr != '\x03')) ||
                (iVar29 = CBS_get_u16((CBS *)&child,(uint16_t *)&raw), iVar29 == 0)) ||
               (iVar29 = CBS_get_u8_length_prefixed((CBS *)&child,(CBS *)ech_enc), iVar29 == 0)) {
              in_R8 = (CRYPTO_BUFFER_POOL *)0x411;
              goto LAB_0013ed51;
            }
            bVar19 = tls1_check_group_id(hs,CONCAT11(raw._1_1_,(char)raw));
            if (!bVar19) {
              in_R8 = (CRYPTO_BUFFER_POOL *)0x418;
              ERR_put_error(0x10,0,0xf3,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x418);
              uVar31 = 0x2f;
              goto LAB_0013ed5f;
            }
            ((local_308->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->group_id =
                 CONCAT11(raw._1_1_,(char)raw);
            in_04.data_._1_1_ = ech_enc[1];
            in_04.data_._0_1_ = ech_enc[0];
            in_04.data_._2_1_ = ech_enc[2];
            in_04.data_._3_1_ = ech_enc[3];
            in_04.data_._4_1_ = ech_enc[4];
            in_04.data_._5_1_ = ech_enc[5];
            in_04.data_._6_1_ = ech_enc[6];
            in_04.data_._7_1_ = ech_enc[7];
            in_04.size_._0_1_ = ech_enc[8];
            in_04.size_._1_1_ = ech_enc[9];
            in_04.size_._2_1_ = ech_enc[10];
            in_04.size_._3_1_ = ech_enc[0xb];
            in_04.size_._4_1_ = ech_enc[0xc];
            in_04.size_._5_1_ = ech_enc[0xd];
            in_04.size_._6_1_ = ech_enc[0xe];
            in_04.size_._7_1_ = ech_enc[0xf];
            bVar19 = Array<unsigned_char>::CopyFrom(&hs->peer_key,in_04);
            sVar28 = ssl_hs_error;
            if (!bVar19) break;
          }
          uVar13 = body._8_8_;
          sVar35 = (long)body.u.base.buf - child._8_8_;
          bVar19 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
          if (!bVar19) {
            if (uVar5 != 8) {
              __assert_fail("alg_a == SSL_aPSK",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x468,
                            "enum ssl_hs_wait_t bssl::do_read_server_key_exchange(SSL_HANDSHAKE *)")
              ;
            }
            if (child._8_8_ != 0) {
              iVar29 = 0x97;
              in_R8 = (CRYPTO_BUFFER_POOL *)0x46b;
              goto LAB_0013ea71;
            }
LAB_0013f739:
            (*pSVar41->method->next_message)(pSVar41);
            goto LAB_0013f742;
          }
          signature_algorithm._0_1_ = 0;
          signature_algorithm._1_1_ = 0;
          uVar21 = ssl_protocol_version(pSVar41);
          if (uVar21 < 0x303) {
            bVar19 = tls1_get_legacy_signature_algorithm
                               (&signature_algorithm,
                                (local_280->_M_t).
                                super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
            if (bVar19) {
LAB_0013f618:
              iVar29 = CBS_get_u16_length_prefixed((CBS *)&child,(CBS *)&raw);
              if ((iVar29 == 0) || (child._8_8_ != 0)) {
                iVar29 = 0x89;
                in_R8 = (CRYPTO_BUFFER_POOL *)0x44a;
                goto LAB_0013ea71;
              }
              CBB_zero((CBB *)ech_enc);
              ptr = (uint8_t *)0x0;
              pCStack_2b0 = (CRYPTO_BUFFER_POOL *)0x0;
              iVar29 = CBB_init((CBB *)ech_enc,sVar35 + 0x40);
              if (((iVar29 == 0) ||
                  (iVar29 = CBB_add_bytes((CBB *)ech_enc,pSVar41->s3->client_random,0x20),
                  iVar29 == 0)) ||
                 ((iVar29 = CBB_add_bytes((CBB *)ech_enc,pSVar41->s3->server_random,0x20),
                  iVar29 == 0 ||
                  ((iVar29 = CBB_add_bytes((CBB *)ech_enc,(uint8_t *)uVar13,sVar35), iVar29 == 0 ||
                   (bVar19 = CBBFinishArray((CBB *)ech_enc,(Array<unsigned_char> *)&ptr), !bVar19)))
                  ))) {
                in_R8 = (CRYPTO_BUFFER_POOL *)0x45a;
                ERR_put_error(0x10,0,0x44,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x45a);
                iVar29 = 0x50;
              }
              else {
                signature.data_._1_1_ = raw._1_1_;
                signature.data_._0_1_ = (char)raw;
                signature.data_._2_6_ = raw._2_6_;
                signature.size_ = (size_t)pCStack_270;
                in_R8 = (CRYPTO_BUFFER_POOL *)
                        (local_280->_M_t).
                        super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
                sig_len._0_1_ = (byte)ptr;
                sig_len._1_7_ = (int7)((ulong)ptr >> 8);
                pCStack_310 = pCStack_2b0;
                in_stack_fffffffffffffcd8 = SUB84(ptr,0);
                in_stack_fffffffffffffcdc = (undefined4)((ulong)ptr >> 0x20);
                in_00.size_ = (size_t)pCStack_2b0;
                in_00.data_ = ptr;
                in_stack_fffffffffffffce0 = pCStack_2b0;
                bVar19 = ssl_public_key_verify
                                   (pSVar41,signature,
                                    CONCAT11(signature_algorithm._1_1_,(byte)signature_algorithm),
                                    (EVP_PKEY *)in_R8,in_00);
                if (bVar19) {
                  Array<unsigned_char>::~Array((Array<unsigned_char> *)&ptr);
                  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)ech_enc);
                  goto LAB_0013f739;
                }
                in_R8 = (CRYPTO_BUFFER_POOL *)0x462;
                ERR_put_error(0x10,0,0x72,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x462);
                iVar29 = 0x33;
              }
              ssl_send_alert(pSVar41,2,iVar29);
              Array<unsigned_char>::~Array((Array<unsigned_char> *)&ptr);
              goto LAB_0013e939;
            }
            in_R8 = (CRYPTO_BUFFER_POOL *)0x441;
            ERR_put_error(0x10,0,0xc1,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x441);
            uVar31 = 0x2b;
          }
          else {
            iVar29 = CBS_get_u16((CBS *)&child,&signature_algorithm);
            if (iVar29 == 0) {
              in_R8 = (CRYPTO_BUFFER_POOL *)0x434;
              ERR_put_error(0x10,0,0x89,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x434);
              uVar31 = 0x32;
            }
            else {
              ech_enc[0] = '2';
              bVar19 = tls12_check_peer_sigalg
                                 (hs,ech_enc,
                                  CONCAT11(signature_algorithm._1_1_,(byte)signature_algorithm),
                                  (hs->peer_pubkey)._M_t.
                                  super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
              if (bVar19) {
                ((local_308->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                peer_signature_algorithm =
                     CONCAT11(signature_algorithm._1_1_,(byte)signature_algorithm);
                goto LAB_0013f618;
              }
              uVar31 = (uint)ech_enc[0];
            }
          }
        }
        else {
          iVar29 = CBS_get_u16_length_prefixed((CBS *)&child,(CBS *)ech_enc);
          if (iVar29 != 0) {
            if ((0x80 < (ulong)ech_enc._8_8_) ||
               (iVar29 = CBS_contains_zero_byte((CBS *)ech_enc), iVar29 != 0)) {
              in_R8 = (CRYPTO_BUFFER_POOL *)0x3f5;
              ERR_put_error(0x10,0,0x88,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x3f5);
              uVar31 = 0x28;
              goto LAB_0013ed5f;
            }
            raw._0_1_ = '\0';
            raw._1_1_ = '\0';
            raw._2_6_ = 0;
            if (ech_enc._8_8_ == 0) {
              __p_02 = (pointer)0x0;
            }
            else {
              iVar29 = CBS_strdup((CBS *)ech_enc,&raw);
              if (iVar29 == 0) goto LAB_0013f1c2;
              __p_02 = (pointer)CONCAT62(raw._2_6_,CONCAT11(raw._1_1_,(char)raw));
            }
            std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)&hs->peer_psk_identity_hint
                       ,__p_02);
            goto LAB_0013d50f;
          }
          in_R8 = (CRYPTO_BUFFER_POOL *)0x3e7;
LAB_0013ed51:
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,(int)in_R8);
          uVar31 = 0x32;
        }
LAB_0013ed5f:
        ssl_send_alert(pSVar41,2,uVar31);
LAB_0013ed64:
        sVar28 = ssl_hs_error;
      }
      break;
    case 10:
      pSVar42 = (SSL *)hs->ssl;
      bVar19 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
      if (!bVar19) {
LAB_0013db0a:
        hs->state = 0xb;
        goto LAB_0013db8c;
      }
      cVar20 = (**(code **)(*(long *)pSVar42 + 0x18))(pSVar42);
      sVar28 = ssl_hs_read_message;
      if (cVar20 == '\0') break;
      if (ech_enc[1] == '\x0e') {
        SSLTranscript::FreeBuffer(this);
        goto LAB_0013db0a;
      }
      bVar19 = ssl_check_message_type((SSL *)pSVar42,(SSLMessage *)ech_enc,0xd);
      sVar28 = ssl_hs_error;
      if ((!bVar19) || (bVar19 = ssl_hash_message(hs,(SSLMessage *)ech_enc), !bVar19)) break;
      body._10_1_ = ech_enc[0x12];
      body._11_1_ = ech_enc[0x13];
      body._12_1_ = ech_enc[0x14];
      body._13_1_ = ech_enc[0x15];
      body._14_1_ = ech_enc[0x16];
      body._15_1_ = ech_enc[0x17];
      body.is_child = ech_enc[0x10];
      body._9_1_ = ech_enc[0x11];
      body.child._0_1_ = (uint8_t)ech_enc._8_8_;
      body.child._1_1_ = SUB81(ech_enc._8_8_,1);
      body.child._2_6_ = SUB86(ech_enc._8_8_,2);
      iVar29 = CBS_get_u8_length_prefixed((CBS *)&body,(CBS *)&child);
      if (iVar29 == 0) {
        ssl_send_alert((SSL *)pSVar42,2,0x32);
        iVar29 = 0x89;
        in_R8 = (CRYPTO_BUFFER_POOL *)0x494;
      }
      else {
        in_03.data_._1_1_ = child.child._1_1_;
        in_03.data_._0_1_ = (byte)child.child;
        in_03.data_._2_1_ = child.child._2_1_;
        in_03.data_._3_1_ = child.child._3_1_;
        in_03.data_._4_4_ = child.child._4_4_;
        in_03.size_ = child._8_8_;
        bVar19 = Array<unsigned_char>::CopyFrom(&hs->certificate_types,in_03);
        if (!bVar19) {
LAB_0013fad8:
          uVar31 = 0x50;
          goto LAB_0013f048;
        }
        uVar21 = ssl_protocol_version((SSL *)pSVar42);
        if ((uVar21 < 0x303) ||
           ((iVar29 = CBS_get_u16_length_prefixed((CBS *)&body,(CBS *)&raw), iVar29 != 0 &&
            (bVar19 = tls1_parse_peer_sigalgs(hs,(CBS *)&raw), bVar19)))) {
          ptr = (uint8_t *)CONCAT71(ptr._1_7_,0x32);
          SSL_parse_CA_list((bssl *)&raw,(SSL *)pSVar42,(uint8_t *)&ptr,(CBS *)&body);
          __p_00 = (pointer)CONCAT62(raw._2_6_,CONCAT11(raw._1_1_,(char)raw));
          if (__p_00 == (pointer)0x0) {
            sVar28 = ssl_hs_error;
            ssl_send_alert((SSL *)pSVar42,2,(uint)(byte)ptr);
          }
          else if (body._8_8_ == 0) {
            hs->field_0x6c8 = hs->field_0x6c8 | 0x20;
            raw._0_1_ = '\0';
            raw._1_1_ = '\0';
            raw._2_6_ = 0;
            std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                       &hs->ca_names,__p_00);
            (**(code **)(*(long *)(pSVar42->packet + 0x10) + 0x50))(hs);
            (**(code **)(*(long *)pSVar42 + 0x20))(pSVar42);
            hs->state = 0xb;
            sVar28 = ssl_hs_ok;
          }
          else {
            ssl_send_alert((SSL *)pSVar42,2,0x32);
            sVar28 = ssl_hs_error;
            in_R8 = (CRYPTO_BUFFER_POOL *)0x4b1;
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x4b1);
          }
          std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&raw);
          break;
        }
        ssl_send_alert((SSL *)pSVar42,2,0x32);
        iVar29 = 0x89;
        in_R8 = (CRYPTO_BUFFER_POOL *)0x4a2;
      }
LAB_0013f81d:
      sVar28 = ssl_hs_error;
      ERR_put_error(0x10,0,iVar29,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                    ,(int)in_R8);
      break;
    case 0xb:
      pSVar41 = hs->ssl;
      bVar19 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)ech_enc);
      sVar28 = ssl_hs_read_message;
      if (bVar19) {
        bVar19 = ssl_check_message_type(pSVar41,(SSLMessage *)ech_enc,0xe);
        sVar28 = ssl_hs_error;
        if ((bVar19) && (bVar19 = ssl_hash_message(hs,(SSLMessage *)ech_enc), bVar19)) {
          if (CONCAT62(ech_enc._18_6_,ech_enc._16_2_) == 0) {
            bVar19 = (*pSVar41->method->has_unprocessed_handshake_data)(pSVar41);
            if (!bVar19) {
              (*pSVar41->method->next_message)(pSVar41);
              hs->state = 0xc;
              goto LAB_0013db8c;
            }
            ssl_send_alert(pSVar41,2,10);
            iVar29 = 0xff;
            in_R8 = (CRYPTO_BUFFER_POOL *)0x4d4;
          }
          else {
            ssl_send_alert(pSVar41,2,0x32);
            iVar29 = 0x89;
            in_R8 = (CRYPTO_BUFFER_POOL *)0x4cd;
          }
          goto LAB_0013f81d;
        }
      }
      break;
    case 0xc:
      if ((hs->field_0x6c8 & 0x20) == 0) {
        hs->state = 0xd;
        goto LAB_0013db8c;
      }
      pSVar41 = hs->ssl;
      if (pSVar41->s3->ech_status == ssl_ech_rejected) {
        SSL_certs_clear(pSVar41);
      }
      else {
        pCVar9 = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
        p_Var10 = pCVar9->cert_cb;
        if (p_Var10 != (_func_int_SSL_ptr_void_ptr *)0x0) {
          iVar29 = (*p_Var10)(pSVar41,pCVar9->cert_cb_arg);
          if (iVar29 == 0) {
            ssl_send_alert(pSVar41,2,0x50);
            sVar28 = ssl_hs_error;
            in_R8 = (CRYPTO_BUFFER_POOL *)0x512;
            ERR_put_error(0x10,0,0x7e,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x512);
          }
          else {
            if (-1 < iVar29) goto LAB_0013e0aa;
            hs->state = 0xc;
            sVar28 = ssl_hs_x509_lookup;
          }
          break;
        }
      }
LAB_0013e0aa:
      ech_enc[0] = '\0';
      ech_enc[1] = '\0';
      ech_enc[2] = '\0';
      ech_enc[3] = '\0';
      ech_enc[4] = '\0';
      ech_enc[5] = '\0';
      ech_enc[6] = '\0';
      ech_enc[7] = '\0';
      ech_enc[8] = '\0';
      ech_enc[9] = '\0';
      ech_enc[10] = '\0';
      ech_enc[0xb] = '\0';
      ech_enc[0xc] = '\0';
      ech_enc[0xd] = '\0';
      ech_enc[0xe] = '\0';
      ech_enc[0xf] = '\0';
      bVar19 = ssl_get_full_credential_list(hs,(Array<ssl_credential_st_*> *)ech_enc);
      sVar28 = ssl_hs_error;
      if (bVar19) {
        if (ech_enc._8_8_ == 0) {
          SSLTranscript::FreeBuffer(this);
        }
        else {
          lVar17 = CONCAT62(ech_enc._2_6_,CONCAT11(ech_enc[1],ech_enc[0]));
          lVar44 = ech_enc._8_8_ << 3;
          local_228 = pSVar41;
          for (lVar43 = 0; lVar44 != lVar43; lVar43 = lVar43 + 8) {
            cred = *(SSL_CREDENTIAL **)(lVar17 + lVar43);
            ERR_clear_error();
            if (cred->type == kX509) {
              iVar29 = EVP_PKEY_id((EVP_PKEY *)
                                   (cred->pubkey)._M_t.
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
              if (iVar29 == 6) {
                body.child._0_1_ = '\x01';
LAB_0013e154:
                puVar34 = (hs->certificate_types).data_;
                puVar34 = std::
                          __find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                                    (puVar34,puVar34 + (hs->certificate_types).size_,&body);
                if (puVar34 != (hs->certificate_types).data_ + (hs->certificate_types).size_) {
                  bVar19 = tls1_choose_signature_algorithm(hs,cred,(uint16_t *)&child);
                  if ((!bVar19) ||
                     (bVar19 = ssl_credential_matches_requested_issuers(hs,cred), !bVar19))
                  goto LAB_0013e1d0;
                  SSL_CREDENTIAL_up_ref(cred);
                  body.child._0_1_ = '\0';
                  body.child._1_1_ = '\0';
                  body.child._2_6_ = 0;
                  std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)
                             local_238,cred);
                  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&body);
                  hs->signature_algorithm = CONCAT11(child.child._1_1_,(byte)child.child);
                  break;
                }
                in_R8 = (CRYPTO_BUFFER_POOL *)0x4f4;
              }
              else if ((iVar29 == 0x3b5) || (in_R8 = (CRYPTO_BUFFER_POOL *)0x4ef, iVar29 == 0x198))
              {
                body.child._0_1_ = '@';
                goto LAB_0013e154;
              }
              ERR_put_error(0x10,0,0xe4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,(int)in_R8);
            }
            else {
              in_R8 = (CRYPTO_BUFFER_POOL *)0x4e0;
              ERR_put_error(0x10,0,0xe4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x4e0);
            }
LAB_0013e1d0:
          }
          pSVar41 = local_228;
          if ((local_238->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl ==
              (ssl_credential_st *)0x0) {
            uVar36 = ERR_peek_error();
            if ((int)uVar36 == 0) {
              __assert_fail("ERR_peek_error() != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x531,
                            "enum ssl_hs_wait_t bssl::do_send_client_certificate(SSL_HANDSHAKE *)");
            }
            ssl_send_alert(pSVar41,2,0x28);
            goto LAB_0013f11b;
          }
        }
        bVar19 = ssl_send_tls12_certificate(hs);
        if (bVar19) {
          hs->state = 0xd;
          sVar28 = ssl_hs_ok;
        }
      }
LAB_0013f11b:
      Array<ssl_credential_st_*>::~Array((Array<ssl_credential_st_*> *)ech_enc);
      break;
    case 0xd:
      pSVar41 = hs->ssl;
      CBB_zero(&child);
      bVar19 = (*pSVar41->method->init_message)(pSVar41,&child,(CBB *)&raw,'\x10');
      sVar28 = ssl_hs_error;
      if (bVar19) {
        sig_len._0_1_ = 0;
        sig_len._1_7_ = 0;
        pCStack_310 = (CRYPTO_BUFFER_POOL *)0x0;
        pSVar38 = hs->new_cipher;
        uVar31 = pSVar38->algorithm_mkey;
        uVar5 = pSVar38->algorithm_auth;
        bVar19 = ssl_cipher_uses_certificate_auth(pSVar38);
        if (bVar19) {
          pCVar33 = (CRYPTO_BUFFER *)
                    OPENSSL_sk_value((OPENSSL_STACK *)
                                     (((local_308->_M_t).
                                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)
                                     ->certs)._M_t.
                                     super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                     ,0);
          CRYPTO_BUFFER_init_CBS(pCVar33,(CBS *)ech_enc);
          bVar19 = ssl_cert_check_key_usage((CBS *)ech_enc,uVar31 * 2 & key_usage_encipherment);
          if (bVar19) goto LAB_0013da41;
          if (((hs->config->field_0x10d & 0x10) == 0) &&
             (iVar29 = EVP_PKEY_id((EVP_PKEY *)
                                   (local_280->_M_t).
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl),
             iVar29 == 6)) {
            ERR_clear_error();
            puVar1 = &pSVar41->s3->field_0xdc;
            *(ushort *)puVar1 = *(ushort *)puVar1 | 0x2000;
            goto LAB_0013da41;
          }
LAB_0013f07d:
          sVar28 = ssl_hs_error;
        }
        else {
LAB_0013da41:
          uVar30 = 0;
          if ((uVar5 & 8) == 0) {
LAB_0013da4e:
            uVar36 = (ulong)uVar30;
            if ((uVar31 & 1) == 0) {
              if ((uVar31 & 2) != 0) {
                iVar29 = CBB_add_u8_length_prefixed((CBB *)&raw,&body);
                if (iVar29 == 0) goto LAB_0013f07d;
                SSLKeyShare::Create((SSLKeyShare *)&ptr,
                                    ((local_308->_M_t).
                                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                    group_id);
                signature_algorithm._0_1_ = 0x32;
                uVar31 = 0x32;
                if (ptr == (uint8_t *)0x0) {
LAB_0013f059:
                  ssl_send_alert(pSVar41,2,uVar31);
                }
                else {
                  in_R8 = (CRYPTO_BUFFER_POOL *)(hs->peer_key).data_;
                  in_R9 = (CRYPTO_BUFFER_POOL *)(hs->peer_key).size_;
                  cVar20 = (**(code **)(*(long *)ptr + 0x20))
                                     (ptr,&body,&sig_len,&signature_algorithm);
                  if (cVar20 == '\0') {
                    uVar31 = (uint)(byte)signature_algorithm;
                    goto LAB_0013f059;
                  }
                  iVar29 = CBB_flush((CBB *)&raw);
                  if (iVar29 != 0) {
                    Array<unsigned_char>::Reset(&hs->peer_key);
                    std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)&ptr);
                    goto LAB_0013ec94;
                  }
                }
                std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)&ptr);
                goto LAB_0013f07d;
              }
              if ((uVar31 & 4) == 0) {
                in_R8 = (CRYPTO_BUFFER_POOL *)0x5c2;
                ssl_send_alert(pSVar41,2,0x28);
                iVar29 = 0x44;
                goto LAB_0013e802;
              }
              bVar19 = Array<unsigned_char>::Init((Array<unsigned_char> *)&sig_len,uVar36);
              if (!bVar19) goto LAB_0013f07d;
LAB_0013ec94:
              if ((uVar5 & 8) != 0) {
                CBB_zero(&body);
                iVar29 = CBB_init(&body,(long)pCStack_310->hash_key + (uVar36 - 0x3c));
                if (((((iVar29 == 0) ||
                      (iVar29 = CBB_add_u16_length_prefixed(&body,(CBB *)&ptr), iVar29 == 0)) ||
                     (iVar29 = CBB_add_bytes((CBB *)&ptr,
                                             (uint8_t *)CONCAT71(sig_len._1_7_,(byte)sig_len),
                                             (size_t)pCStack_310), iVar29 == 0)) ||
                    ((iVar29 = CBB_add_u16_length_prefixed(&body,(CBB *)&ptr), iVar29 == 0 ||
                     (iVar29 = CBB_add_bytes((CBB *)&ptr,ech_enc,uVar36), iVar29 == 0)))) ||
                   (bVar19 = CBBFinishArray(&body,(Array<unsigned_char> *)&sig_len), !bVar19)) {
                  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
                  goto LAB_0013f07d;
                }
                internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                          ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&body);
              }
              bVar19 = ssl_add_message_cbb(pSVar41,&child);
              sVar28 = ssl_hs_error;
              if (bVar19) {
                InplaceVector<unsigned_char,_64UL>::ResizeForOverwrite
                          (&((local_308->_M_t).
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->secret,
                           0x30);
                psVar8 = (hs->new_session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                SVar45.data_ = &psVar8->secret;
                premaster.data_._1_7_ = sig_len._1_7_;
                premaster.data_._0_1_ = (byte)sig_len;
                premaster.size_ = (size_t)pCStack_310;
                SVar45.size_._0_1_ = (psVar8->secret).size_;
                SVar45.size_._1_7_ = 0;
                in_R8 = pCStack_310;
                bVar19 = tls1_generate_master_secret(hs,SVar45,premaster);
                if (bVar19) {
                  psVar8 = (hs->new_session)._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                  psVar8->field_0x1b8 =
                       psVar8->field_0x1b8 & 0xfe | (byte)(*(uint *)&hs->field_0x6c8 >> 0x11) & 1;
                  hs->state = 0xe;
                  sVar28 = ssl_hs_ok;
                }
              }
            }
            else {
              rsa = EVP_PKEY_get0_RSA((local_280->_M_t).
                                      super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
              if (rsa == (RSA *)0x0) {
                sVar28 = ssl_hs_error;
                in_R8 = (CRYPTO_BUFFER_POOL *)0x58e;
                ERR_put_error(0x10,0,0x44,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x58e);
              }
              else {
                bVar19 = Array<unsigned_char>::InitUninitialized
                                   ((Array<unsigned_char> *)&sig_len,0x40);
                sVar28 = ssl_hs_error;
                if (bVar19) {
                  if (((pCStack_310 == (CRYPTO_BUFFER_POOL *)0x0) ||
                      (*(undefined1 *)CONCAT71(sig_len._1_7_,(byte)sig_len) =
                            *(undefined1 *)((long)&hs->client_version + 1),
                      pCStack_310 < (CRYPTO_BUFFER_POOL *)0x2)) ||
                     (*(char *)(CONCAT71(sig_len._1_7_,(byte)sig_len) + 1) =
                           (char)hs->client_version, pCStack_310 < (CRYPTO_BUFFER_POOL *)0x3)) {
                    abort();
                  }
                  iVar29 = RAND_bytes((uchar *)(CONCAT71(sig_len._1_7_,(byte)sig_len) + 2),0x3e);
                  if ((iVar29 != 0) &&
                     (iVar29 = CBB_add_u16_length_prefixed((CBB *)&raw,&body), iVar29 != 0)) {
                    uVar31 = RSA_size((RSA *)rsa);
                    iVar29 = CBB_reserve(&body,&ptr,(ulong)uVar31);
                    if (iVar29 != 0) {
                      local_228 = (SSL *)ptr;
                      uVar31 = RSA_size((RSA *)rsa);
                      in_R8 = (CRYPTO_BUFFER_POOL *)CONCAT71(sig_len._1_7_,(byte)sig_len);
                      in_stack_fffffffffffffcd8 = 1;
                      in_R9 = pCStack_310;
                      iVar29 = RSA_encrypt(rsa,(size_t *)&signature_algorithm,(uint8_t *)local_228,
                                           (ulong)uVar31,(uint8_t *)in_R8,(size_t)pCStack_310,1);
                      if (((iVar29 != 0) &&
                          (iVar29 = CBB_did_write(&body,CONCAT62(uStack_2fe,
                                                                 CONCAT11(signature_algorithm._1_1_,
                                                                          (byte)signature_algorithm)
                                                                )), iVar29 != 0)) &&
                         (iVar29 = CBB_flush((CBB *)&raw), iVar29 != 0)) goto LAB_0013ec94;
                    }
                  }
                }
              }
            }
          }
          else {
            pSVar11 = hs->config;
            if (pSVar11->psk_client_callback !=
                (_func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *)0x0) {
              memset(&body,0,0x81);
              in_R8 = (CRYPTO_BUFFER_POOL *)ech_enc;
              in_R9 = (CRYPTO_BUFFER_POOL *)0x0;
              uVar30 = (*pSVar11->psk_client_callback)
                                 (pSVar41,(hs->peer_psk_identity_hint)._M_t.
                                          super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
                                          super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_char_*,_false>._M_head_impl,
                                  (char *)&body,0x81,(uint8_t *)in_R8,0x100);
              if (uVar30 == 0) {
                in_R8 = (CRYPTO_BUFFER_POOL *)0x575;
                ERR_put_error(0x10,0,0xc3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x575);
                ssl_send_alert(pSVar41,2,0x28);
              }
              else {
                if (0x100 < uVar30) {
                  __assert_fail("psk_len <= PSK_MAX_PSK_LEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,0x579,
                                "enum ssl_hs_wait_t bssl::do_send_client_key_exchange(SSL_HANDSHAKE *)"
                               );
                }
                psVar8 = (local_308->_M_t).
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                __p_01 = OPENSSL_strdup((char *)&body);
                std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)&psVar8->psk_identity,
                           __p_01);
                if (((_Head_base<0UL,_char_*,_false>)
                     *(_Tuple_impl<0UL,_char_*,_bssl::internal::Deleter> *)
                      &(((local_308->_M_t).
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->psk_identity)
                       ._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter> != (char *)0x0) &&
                   (iVar29 = CBB_add_u16_length_prefixed((CBB *)&raw,(CBB *)&ptr), iVar29 != 0)) {
                  sVar35 = OPENSSL_strnlen((char *)&body,0x81);
                  iVar29 = CBB_add_bytes((CBB *)&ptr,(uint8_t *)&body,sVar35);
                  if ((iVar29 != 0) && (iVar29 = CBB_flush((CBB *)&raw), iVar29 != 0))
                  goto LAB_0013da4e;
                }
              }
              goto LAB_0013f07d;
            }
            in_R8 = (CRYPTO_BUFFER_POOL *)0x56b;
            iVar29 = 0xc4;
LAB_0013e802:
            sVar28 = ssl_hs_error;
            ERR_put_error(0x10,0,iVar29,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,(int)in_R8);
          }
        }
        Array<unsigned_char>::~Array((Array<unsigned_char> *)&sig_len);
      }
      internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&child);
      break;
    case 0xe:
      if (((hs->field_0x6c8 & 0x20) == 0) ||
         ((local_238->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl == (ssl_credential_st *)0x0
         )) {
        hs->state = 0xf;
        goto LAB_0013db8c;
      }
      pSVar41 = hs->ssl;
      CBB_zero((CBB *)ech_enc);
      bVar19 = (*pSVar41->method->init_message)(pSVar41,(CBB *)ech_enc,&body,'\x0f');
      sVar28 = ssl_hs_error;
      if (bVar19) {
        if (hs->signature_algorithm == 0) {
          __assert_fail("hs->signature_algorithm != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,0x5f4,
                        "enum ssl_hs_wait_t bssl::do_send_client_certificate_verify(SSL_HANDSHAKE *)"
                       );
        }
        uVar21 = ssl_protocol_version(pSVar41);
        if ((uVar21 < 0x303) || (iVar29 = CBB_add_u16(&body,hs->signature_algorithm), iVar29 != 0))
        {
          iVar29 = EVP_PKEY_size((EVP_PKEY *)
                                 (((local_238->_M_t).
                                   super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl)
                                 ->pubkey)._M_t.
                                 super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>);
          iVar25 = CBB_add_u16_length_prefixed(&body,&child);
          sVar28 = ssl_hs_error;
          if (iVar25 != 0) {
            iVar25 = CBB_reserve(&child,&ptr,(long)iVar29);
            if (iVar25 != 0) {
              sig_len._0_1_ = (byte)iVar29;
              sig_len._1_7_ = (int7)(int3)((uint)iVar29 >> 8);
              in_R8 = (CRYPTO_BUFFER_POOL *)(ulong)hs->signature_algorithm;
              _Var7._M_head_impl =
                   (hs->transcript).buffer_._M_t.
                   super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
              in_stack_fffffffffffffce0 = (CRYPTO_BUFFER_POOL *)(_Var7._M_head_impl)->length;
              puVar34 = (uchar *)(_Var7._M_head_impl)->data;
              raw._0_1_ = (char)puVar34;
              raw._1_1_ = (char)((ulong)puVar34 >> 8);
              raw._2_6_ = (undefined6)((ulong)puVar34 >> 0x10);
              in_stack_fffffffffffffcd8 = SUB84(puVar34,0);
              in_stack_fffffffffffffcdc = (undefined4)((ulong)puVar34 >> 0x20);
              in.size_ = (size_t)in_stack_fffffffffffffce0;
              in.data_ = puVar34;
              pCStack_270 = in_stack_fffffffffffffce0;
              sVar26 = ssl_private_key_sign(hs,ptr,&sig_len,(long)iVar29,hs->signature_algorithm,in)
              ;
              iVar29 = 0xe;
              sVar28 = ssl_hs_private_key_operation;
              if (sVar26 != ssl_private_key_retry) {
                sVar28 = ssl_hs_error;
                if (((sVar26 == ssl_private_key_failure) ||
                    (iVar29 = CBB_did_write(&child,CONCAT71(sig_len._1_7_,(byte)sig_len)),
                    iVar29 == 0)) || (bVar19 = ssl_add_message_cbb(pSVar41,(CBB *)ech_enc), !bVar19)
                   ) goto LAB_0013ec4e;
                SSLTranscript::FreeBuffer(this);
                iVar29 = 0xf;
                sVar28 = ssl_hs_ok;
              }
              hs->state = iVar29;
            }
          }
        }
        else {
          sVar28 = ssl_hs_error;
          in_R8 = (CRYPTO_BUFFER_POOL *)0x5f8;
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,0x5f8);
        }
      }
LAB_0013ec4e:
      internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)ech_enc);
      break;
    case 0xf:
      pSVar41 = hs->ssl;
      hs->field_0x6ca = hs->field_0x6ca | 0x80;
      bVar19 = (*pSVar41->method->add_change_cipher_spec)(pSVar41);
      sVar28 = ssl_hs_error;
      if (bVar19) {
        bVar19 = tls1_change_cipher_state(hs,evp_aead_seal);
        sVar28 = ssl_hs_error;
        if (bVar19) {
          uVar31 = *(uint *)&hs->field_0x6c8;
          if ((short)uVar31 < 0) {
            sVar35 = (pSVar41->s3->next_proto_negotiated).size_;
            CBB_zero((CBB *)ech_enc);
            bVar19 = (*pSVar41->method->init_message)(pSVar41,(CBB *)ech_enc,&body,'C');
            if (((bVar19) && (iVar29 = CBB_add_u8_length_prefixed(&body,&child), iVar29 != 0)) &&
               ((iVar29 = CBB_add_bytes(&child,(pSVar41->s3->next_proto_negotiated).data_,
                                        (pSVar41->s3->next_proto_negotiated).size_), iVar29 != 0 &&
                (((iVar29 = CBB_add_u8_length_prefixed(&body,&child), iVar29 != 0 &&
                  (iVar29 = CBB_add_bytes(&child,do_send_client_finished(bssl::SSL_HANDSHAKE*)::
                                                 kZero,0x20 - (ulong)((int)sVar35 + 2U & 0x1f)),
                  iVar29 != 0)) && (bVar19 = ssl_add_message_cbb(pSVar41,(CBB *)ech_enc), bVar19))))
               )) {
              internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                        ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)ech_enc);
              uVar31 = *(uint *)&hs->field_0x6c8;
              goto LAB_0013d5d3;
            }
            in_R8 = (CRYPTO_BUFFER_POOL *)0x634;
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x634);
LAB_0013e939:
            internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                      ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)ech_enc);
            goto LAB_0013ed64;
          }
LAB_0013d5d3:
          if ((uVar31 >> 0x18 & 1) != 0) {
            CBB_zero((CBB *)ech_enc);
            bVar19 = (*pSVar41->method->init_message)(pSVar41,(CBB *)ech_enc,&body,0xcb);
            if (((!bVar19) || (bVar19 = tls1_write_channel_id(hs,&body), !bVar19)) ||
               (bVar19 = ssl_add_message_cbb(pSVar41,(CBB *)ech_enc), !bVar19)) {
              in_R8 = (CRYPTO_BUFFER_POOL *)0x63f;
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x63f);
              goto LAB_0013e939;
            }
            internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                      ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)ech_enc);
          }
          bVar19 = ssl_send_finished(hs);
          sVar28 = ssl_hs_error;
          if (bVar19) {
            hs->state = 0x10;
LAB_0013d5fc:
            sVar28 = ssl_hs_flush;
          }
        }
      }
      break;
    case 0x10:
      pSVar41 = hs->ssl;
      if ((pSVar41->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
          _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl != (ssl_session_st *)0x0)
      goto LAB_0013d478;
      bVar19 = tls1_record_handshake_hashes_for_channel_id(hs);
      sVar28 = ssl_hs_error;
      if (bVar19) {
        hs->state = 0x11;
        uVar24 = SSL_get_mode(pSVar41);
        sVar28 = ssl_hs_ok;
        if ((char)uVar24 < '\0') {
          pSVar42 = (SSL *)hs->ssl;
          iVar29 = SSL_is_dtls((SSL *)pSVar42);
          sVar28 = ssl_hs_ok;
          if (iVar29 == 0) {
            iVar29 = SSL_version(pSVar42);
            sVar28 = ssl_hs_ok;
            if ((((((iVar29 == 0x303) && (hs->new_cipher->algorithm_mkey == 2)) &&
                  (hs->new_cipher->algorithm_mac == 4)) &&
                 (p_Var6 = pSVar42->handshake_func, *(int *)(p_Var6 + 0xd8) != 2)) &&
                ((((pSVar42->packet[0x289] & 1) != 0 || (*(long *)(p_Var6 + 0x220) != 0)) ||
                 (*(long *)(p_Var6 + 0x210) != 0)))) && ((pSVar41->s3->field_0xdc & 0x10) == 0)) {
              hs->field_0x6c9 = hs->field_0x6c9 | 0x22;
              sVar28 = ssl_hs_early_return;
            }
          }
        }
      }
      break;
    case 0x11:
      if ((hs->field_0x6ca & 1) == 0) {
LAB_0013d808:
        hs->state = 0x12;
        sVar28 = ssl_hs_read_change_cipher_spec;
      }
      else {
        pSVar41 = hs->ssl;
        bVar19 = (*pSVar41->method->get_message)(pSVar41,(SSLMessage *)ech_enc);
        sVar28 = ssl_hs_read_message;
        if (bVar19) {
          bVar19 = ssl_check_message_type(pSVar41,(SSLMessage *)ech_enc,4);
          sVar28 = ssl_hs_error;
          if ((bVar19) && (bVar19 = ssl_hash_message(hs,(SSLMessage *)ech_enc), bVar19)) {
            body._10_1_ = ech_enc[0x12];
            body._11_1_ = ech_enc[0x13];
            body._12_1_ = ech_enc[0x14];
            body._13_1_ = ech_enc[0x15];
            body._14_1_ = ech_enc[0x16];
            body._15_1_ = ech_enc[0x17];
            body.is_child = ech_enc[0x10];
            body._9_1_ = ech_enc[0x11];
            body.child._0_1_ = (uint8_t)ech_enc._8_8_;
            body.child._1_1_ = SUB81(ech_enc._8_8_,1);
            body.child._2_6_ = SUB86(ech_enc._8_8_,2);
            iVar29 = CBS_get_u32((CBS *)&body,(uint32_t *)&ptr);
            if ((iVar29 == 0) ||
               ((iVar29 = CBS_get_u16_length_prefixed((CBS *)&body,(CBS *)&child),
                pUVar18 = local_308, iVar29 == 0 || (body._8_8_ != 0)))) {
              ssl_send_alert(pSVar41,2,0x32);
              iVar29 = 0x89;
              in_R8 = (CRYPTO_BUFFER_POOL *)0x6a7;
              goto LAB_0013f81d;
            }
            if (child._8_8_ == 0) {
              hs->field_0x6ca = hs->field_0x6ca & 0xfe;
            }
            else {
              pSVar40 = (pSVar41->session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              session = (local_308->_M_t).
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              if (pSVar40 != (SSL_SESSION *)0x0) {
                if (session != (SSL_SESSION *)0x0) {
                  __assert_fail("!hs->new_session",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,0x6b9,
                                "enum ssl_hs_wait_t bssl::do_read_session_ticket(SSL_HANDSHAKE *)");
                }
                SSL_SESSION_dup((bssl *)&raw,pSVar40,2);
                psVar16 = (pointer)CONCAT62(raw._2_6_,CONCAT11(raw._1_1_,(char)raw));
                raw._0_1_ = '\0';
                raw._1_1_ = '\0';
                raw._2_6_ = 0;
                std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)pUVar18,
                           psVar16);
                std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&raw);
                session = (pUVar18->_M_t).
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                if (session == (SSL_SESSION *)0x0) goto LAB_0013f04d;
              }
              ssl_session_rebase_time(pSVar41,session);
              in_02.data_._1_1_ = child.child._1_1_;
              in_02.data_._0_1_ = (byte)child.child;
              in_02.data_._2_1_ = child.child._2_1_;
              in_02.data_._3_1_ = child.child._3_1_;
              in_02.data_._4_4_ = child.child._4_4_;
              in_02.size_ = child._8_8_;
              bVar19 = Array<unsigned_char>::CopyFrom
                                 (&((pUVar18->_M_t).
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                   ticket,in_02);
              if (!bVar19) goto LAB_0013f04d;
              psVar8 = (hs->new_session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              psVar8->ticket_lifetime_hint = (uint32_t)ptr;
              InplaceVector<unsigned_char,_32UL>::ResizeForOverwrite(&psVar8->session_id,0x20);
              SHA256((uchar *)CONCAT44(child.child._4_4_,
                                       CONCAT13(child.child._3_1_,
                                                CONCAT12(child.child._2_1_,
                                                         CONCAT11(child.child._1_1_,
                                                                  (byte)child.child)))),child._8_8_,
                     (uchar *)&((hs->new_session)._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                               session_id);
            }
            (*pSVar41->method->next_message)(pSVar41);
            goto LAB_0013d808;
          }
        }
      }
      break;
    case 0x12:
      sVar28 = ssl_hs_error;
      bVar19 = tls1_change_cipher_state(hs,evp_aead_open);
      if (bVar19) {
        hs->state = 0x13;
        goto LAB_0013db8c;
      }
      break;
    case 0x13:
      pSVar41 = hs->ssl;
      sVar28 = ssl_get_finished(hs);
      if (sVar28 == ssl_hs_ok) {
        iVar29 = (uint)((pSVar41->session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
                       (ssl_session_st *)0x0) * 5 + 0xf;
        goto LAB_0013db79;
      }
      break;
    case 0x14:
      pSVar41 = hs->ssl;
      if (pSVar41->s3->ech_status == ssl_ech_rejected) {
        hs->field_0x6c8 = hs->field_0x6c8 | 2;
        ssl_send_alert(pSVar41,2,0x79);
        sVar28 = ssl_hs_error;
        in_R8 = (CRYPTO_BUFFER_POOL *)0x6f3;
        ERR_put_error(0x10,0,0x13f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                      ,0x6f3);
      }
      else {
        (*pSVar41->method->on_handshake_complete)(pSVar41);
        pSVar40 = (local_308->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        if (pSVar40 == (SSL_SESSION *)0x0) {
          if ((pSVar41->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
              ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl == (ssl_session_st *)0x0)
          {
            __assert_fail("ssl->session != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x70e,
                          "enum ssl_hs_wait_t bssl::do_finish_client_handshake(SSL_HANDSHAKE *)");
          }
          UpRef((bssl *)ech_enc,&pSVar41->session);
          psVar16 = (pointer)CONCAT62(ech_enc._2_6_,CONCAT11(ech_enc[1],ech_enc[0]));
          ech_enc[0] = '\0';
          ech_enc[1] = '\0';
          ech_enc[2] = '\0';
          ech_enc[3] = '\0';
          ech_enc[4] = '\0';
          ech_enc[5] = '\0';
          ech_enc[6] = '\0';
          ech_enc[7] = '\0';
          std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                     &pSVar41->s3->established_session,psVar16);
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)ech_enc);
        }
        else {
          SSL_SESSION_dup((bssl *)ech_enc,pSVar40,3);
          psVar16 = (pointer)CONCAT62(ech_enc._2_6_,CONCAT11(ech_enc[1],ech_enc[0]));
          ech_enc[0] = '\0';
          ech_enc[1] = '\0';
          ech_enc[2] = '\0';
          ech_enc[3] = '\0';
          ech_enc[4] = '\0';
          ech_enc[5] = '\0';
          ech_enc[6] = '\0';
          ech_enc[7] = '\0';
          std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                     &pSVar41->s3->established_session,psVar16);
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)ech_enc);
          psVar8 = (pSVar41->s3->established_session)._M_t.
                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          sVar28 = ssl_hs_error;
          if (psVar8 == (ssl_session_st *)0x0) break;
          if ((pSVar41->s3->field_0xdc & 0x10) == 0) {
            puVar1 = &psVar8->field_0x1b8;
            *puVar1 = *puVar1 & 0xfb;
          }
          std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)local_308,
                     (pointer)0x0);
        }
        hs->field_0x6c8 = hs->field_0x6c8 | 8;
        puVar1 = &pSVar41->s3->field_0xdc;
        *(ushort *)puVar1 = *(ushort *)puVar1 | 0x10;
        if (pSVar40 != (SSL_SESSION *)0x0) {
          ssl_update_cache(pSVar41);
        }
        hs->state = 0x15;
LAB_0013f749:
        sVar28 = ssl_hs_ok;
      }
      break;
    case 0x15:
      ssl_do_info_callback(hs->ssl,0x20,1);
      return ssl_hs_ok;
    }
    if (hs->state != iVar4) {
      ssl_do_info_callback(hs->ssl,0x1001,1);
    }
    if (sVar28 != ssl_hs_ok) {
      return sVar28;
    }
  } while( true );
}

Assistant:

enum ssl_hs_wait_t ssl_client_handshake(SSL_HANDSHAKE *hs) {
  while (hs->state != state_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum ssl_client_hs_state_t state =
        static_cast<enum ssl_client_hs_state_t>(hs->state);
    switch (state) {
      case state_start_connect:
        ret = do_start_connect(hs);
        break;
      case state_enter_early_data:
        ret = do_enter_early_data(hs);
        break;
      case state_early_reverify_server_certificate:
        ret = do_early_reverify_server_certificate(hs);
        break;
      case state_read_server_hello:
        ret = do_read_server_hello(hs);
        break;
      case state_tls13:
        ret = do_tls13(hs);
        break;
      case state_read_server_certificate:
        ret = do_read_server_certificate(hs);
        break;
      case state_read_certificate_status:
        ret = do_read_certificate_status(hs);
        break;
      case state_verify_server_certificate:
        ret = do_verify_server_certificate(hs);
        break;
      case state_reverify_server_certificate:
        ret = do_reverify_server_certificate(hs);
        break;
      case state_read_server_key_exchange:
        ret = do_read_server_key_exchange(hs);
        break;
      case state_read_certificate_request:
        ret = do_read_certificate_request(hs);
        break;
      case state_read_server_hello_done:
        ret = do_read_server_hello_done(hs);
        break;
      case state_send_client_certificate:
        ret = do_send_client_certificate(hs);
        break;
      case state_send_client_key_exchange:
        ret = do_send_client_key_exchange(hs);
        break;
      case state_send_client_certificate_verify:
        ret = do_send_client_certificate_verify(hs);
        break;
      case state_send_client_finished:
        ret = do_send_client_finished(hs);
        break;
      case state_finish_flight:
        ret = do_finish_flight(hs);
        break;
      case state_read_session_ticket:
        ret = do_read_session_ticket(hs);
        break;
      case state_process_change_cipher_spec:
        ret = do_process_change_cipher_spec(hs);
        break;
      case state_read_server_finished:
        ret = do_read_server_finished(hs);
        break;
      case state_finish_client_handshake:
        ret = do_finish_client_handshake(hs);
        break;
      case state_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_CONNECT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  ssl_do_info_callback(hs->ssl, SSL_CB_HANDSHAKE_DONE, 1);
  return ssl_hs_ok;
}